

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error ft_stroker_process_corner(PVG_FT_Stroker stroker,PVG_FT_Fixed line_length)

{
  PVG_FT_Error PVar1;
  PVG_FT_Angle PVar2;
  uint side;
  
  PVar2 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  if (PVar2 != 0) {
    side = (uint)((ulong)PVar2 >> 0x3f);
    ft_stroker_inside(stroker,side,line_length);
    PVar1 = ft_stroker_outside(stroker,side ^ 1,line_length);
    return PVar1;
  }
  return 0;
}

Assistant:

static PVG_FT_Error ft_stroker_process_corner(PVG_FT_Stroker stroker,
                                             PVG_FT_Fixed   line_length)
{
    PVG_FT_Error error = 0;
    PVG_FT_Angle turn;
    PVG_FT_Int   inside_side;

    turn = PVG_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);

    /* no specific corner processing is required if the turn is 0 */
    if (turn == 0) goto Exit;

    /* when we turn to the right, the inside side is 0 */
    inside_side = 0;

    /* otherwise, the inside side is 1 */
    if (turn < 0) inside_side = 1;

    /* process the inside side */
    error = ft_stroker_inside(stroker, inside_side, line_length);
    if (error) goto Exit;

    /* process the outside side */
    error = ft_stroker_outside(stroker, 1 - inside_side, line_length);

Exit:
    return error;
}